

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UInt8Type.cpp
# Opt level: O0

void __thiscall hdc::UInt8Type::UInt8Type(UInt8Type *this,Token *token)

{
  Token *token_local;
  UInt8Type *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220048;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_UINT8_TYPE;
  return;
}

Assistant:

UInt8Type::UInt8Type(Token& token) {
    this->token = token;
    this->kind = AST_UINT8_TYPE;
}